

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

int map_set_(map_base_t *m,char *key,void *value,int vsize,char *alloc_category)

{
  map_node_t *pmVar1;
  map_node_t *pmVar2;
  uint uVar3;
  map_node_t **ppmVar4;
  size_t sVar5;
  map_node_t *mem;
  char cVar6;
  uint uVar7;
  map_node_t **ppmVar8;
  ulong uVar9;
  char *pcVar10;
  void *__dest;
  map_node_t *pmVar11;
  long lVar12;
  
  ppmVar4 = map_getref(m,key);
  if (ppmVar4 == (map_node_t **)0x0) {
    sVar5 = strlen(key);
    uVar3 = (uint)sVar5;
    lVar12 = (long)(int)((~uVar3 & 7) + uVar3 + 1);
    mem = (map_node_t *)golf_alloc_tracked(lVar12 + vsize + 0x18,alloc_category);
    if (mem == (map_node_t *)0x0) {
      return -1;
    }
    memcpy(mem + 1,key,(long)(int)(uVar3 + 1));
    cVar6 = *key;
    if (cVar6 == '\0') {
      uVar3 = 0x1505;
    }
    else {
      pcVar10 = key + 1;
      uVar3 = 0x1505;
      do {
        uVar3 = (int)cVar6 ^ uVar3 * 0x21;
        cVar6 = *pcVar10;
        pcVar10 = pcVar10 + 1;
      } while (cVar6 != '\0');
    }
    mem->hash = uVar3;
    __dest = (void *)((long)&mem[1].hash + lVar12);
    mem->value = __dest;
    memcpy(__dest,value,(long)vsize);
    uVar3 = m->nbuckets;
    uVar7 = m->nnodes;
    if (uVar3 <= uVar7) {
      ppmVar4 = m->buckets;
      uVar9 = 1;
      if (uVar3 == 0) {
        pmVar11 = (map_node_t *)0x0;
      }
      else {
        uVar9 = (ulong)(uVar3 * 2);
        lVar12 = (long)(int)uVar3;
        pmVar11 = (map_node_t *)0x0;
        do {
          pmVar1 = ppmVar4[lVar12 + -1];
          while (pmVar2 = pmVar1, pmVar2 != (map_node_t *)0x0) {
            pmVar1 = pmVar2->next;
            pmVar2->next = pmVar11;
            pmVar11 = pmVar2;
          }
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      ppmVar4 = (map_node_t **)
                golf_realloc_tracked(ppmVar4,(long)(int)(uint)uVar9 << 3,alloc_category);
      if (ppmVar4 == (map_node_t **)0x0) {
        ppmVar8 = m->buckets;
        if (ppmVar8 == (map_node_t **)0x0) goto LAB_0012e05e;
        uVar9 = (ulong)m->nbuckets;
      }
      else {
        m->buckets = ppmVar4;
        m->nbuckets = (uint)uVar9;
        ppmVar8 = ppmVar4;
      }
      memset(ppmVar8,0,uVar9 << 3);
      if (pmVar11 != (map_node_t *)0x0) {
        uVar3 = m->nbuckets;
        do {
          pmVar1 = pmVar11->next;
          ppmVar8 = m->buckets;
          uVar7 = pmVar11->hash & uVar3 - 1;
          pmVar11->next = ppmVar8[(int)uVar7];
          ppmVar8[(int)uVar7] = pmVar11;
          pmVar11 = pmVar1;
        } while (pmVar1 != (map_node_t *)0x0);
      }
      if (ppmVar4 == (map_node_t **)0x0) {
LAB_0012e05e:
        golf_free_tracked(mem);
        return -1;
      }
      uVar3 = m->nbuckets;
      uVar7 = m->nnodes;
    }
    uVar3 = uVar3 - 1 & mem->hash;
    ppmVar4 = m->buckets;
    mem->next = ppmVar4[(int)uVar3];
    ppmVar4[(int)uVar3] = mem;
    m->nnodes = uVar7 + 1;
  }
  else {
    memcpy((*ppmVar4)->value,value,(long)vsize);
  }
  return 0;
}

Assistant:

int map_set_(map_base_t *m, const char *key, void *value, int vsize, const char *alloc_category) {
  int n, err;
  map_node_t **next, *node;
  /* Find & replace existing node */
  next = map_getref(m, key);
  if (next) {
    memcpy((*next)->value, value, vsize);
    return 0;
  }
  /* Add new node */
  node = map_newnode(key, value, vsize, alloc_category);
  if (node == NULL) goto fail;
  if (m->nnodes >= m->nbuckets) {
    n = (m->nbuckets > 0) ? (m->nbuckets << 1) : 1;
    err = map_resize(m, n, alloc_category);
    if (err) goto fail;
  }
  map_addnode(m, node);
  m->nnodes++;
  return 0;
  fail:
  if (node) golf_free(node);
  return -1;
}